

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_0::FBSCodeGenerator::~FBSCodeGenerator(FBSCodeGenerator *this)

{
  FBSCodeGenerator *this_local;
  
  ~FBSCodeGenerator(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit FBSCodeGenerator(const bool no_log) : no_log_(no_log) {}